

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_statement.cpp
# Opt level: O3

unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true> __thiscall
duckdb::SelectStatement::Deserialize(SelectStatement *this,Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  _func_int **pp_Var3;
  pointer pSVar4;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var5;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var6;
  case_insensitive_map_t<idx_t> *pcVar7;
  undefined1 local_60 [56];
  
  pp_Var3 = (_func_int **)operator_new(0x80);
  *(undefined1 *)(pp_Var3 + 1) = 1;
  pp_Var3[2] = (_func_int *)0x0;
  pp_Var3[3] = (_func_int *)0x0;
  pp_Var3[4] = (_func_int *)(pp_Var3 + 10);
  pp_Var3[5] = (_func_int *)0x1;
  pp_Var3[6] = (_func_int *)0x0;
  pp_Var3[7] = (_func_int *)0x0;
  *(undefined4 *)(pp_Var3 + 8) = 0x3f800000;
  pp_Var3[9] = (_func_int *)0x0;
  pp_Var3[10] = (_func_int *)0x0;
  pp_Var3[0xb] = (_func_int *)(pp_Var3 + 0xd);
  pp_Var3[0xc] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var3 + 0xd) = 0;
  *pp_Var3 = (_func_int *)&PTR__SelectStatement_01986d88;
  pp_Var3[0xf] = (_func_int *)0x0;
  (this->super_SQLStatement)._vptr_SQLStatement = pp_Var3;
  pSVar4 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::
           operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                       *)this);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"node");
  if ((char)uVar1 == '\0') {
    _Var5._M_head_impl =
         (pSVar4->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
         ._M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar4->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t
    .super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar2 == '\0') {
      _Var6._M_head_impl = (QueryNode *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      QueryNode::Deserialize((QueryNode *)local_60,deserializer);
      _Var6._M_head_impl = (QueryNode *)local_60._0_8_;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var5._M_head_impl =
         (pSVar4->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
         ._M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar4->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t
    .super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var6._M_head_impl;
  }
  if (_Var5._M_head_impl != (QueryNode *)0x0) {
    (*(_Var5._M_head_impl)->_vptr_QueryNode[1])();
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  pSVar4 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::
           operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                       *)this);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"named_param_map");
  pcVar7 = &(pSVar4->super_SQLStatement).named_param_map;
  if ((char)uVar1 == '\0') {
    local_60._0_8_ = local_60 + 0x30;
    local_60._8_8_ = 1;
    local_60._16_8_ = (_Hash_node_base *)0x0;
    local_60._24_8_ = (pointer)0x0;
    local_60._32_8_ = (pointer)0x3f800000;
    local_60._40_8_ = (pointer)0x0;
    local_60._48_8_ = (pointer)0x0;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)pcVar7,local_60);
  }
  else {
    Deserializer::
    Read<std::unordered_map<std::__cxx11::string,unsigned_long,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>>
              ((type *)local_60,deserializer);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)pcVar7,local_60);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_60);
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  return (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>)
         (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>)this;
}

Assistant:

unique_ptr<SelectStatement> SelectStatement::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<SelectStatement>(new SelectStatement());
	deserializer.ReadPropertyWithDefault<unique_ptr<QueryNode>>(100, "node", result->node);
	deserializer.ReadPropertyWithDefault<case_insensitive_map_t<idx_t>>(101, "named_param_map", result->named_param_map);
	return result;
}